

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O1

int calc_size(adiak_datatype_t *datatype)

{
  int iVar1;
  adiak_datatype_t **ppaVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  iVar4 = 1;
  for (; datatype->dtype - adiak_range < 3; datatype = *datatype->subtype) {
    iVar4 = iVar4 * (datatype->num_ref_elements + datatype->num_elements);
  }
  switch(datatype->dtype) {
  case adiak_long:
  case adiak_ulong:
  case adiak_double:
  case adiak_date:
  case adiak_timeval:
  case adiak_version:
  case adiak_string:
  case adiak_catstring:
  case adiak_path:
  case adiak_longlong:
  case adiak_ulonglong:
    iVar5 = 8;
    break;
  case adiak_int:
  case adiak_uint:
    iVar5 = 4;
    break;
  default:
    iVar5 = -1;
    break;
  case adiak_tuple:
    iVar1 = datatype->num_subtypes;
    if ((long)iVar1 < 1) {
      iVar5 = 0;
    }
    else {
      ppaVar2 = datatype->subtype;
      lVar6 = 0;
      iVar5 = 0;
      do {
        iVar3 = calc_size(ppaVar2[lVar6]);
        iVar5 = iVar5 + iVar3;
        lVar6 = lVar6 + 1;
      } while (iVar1 != lVar6);
    }
  }
  return iVar4 * iVar5;
}

Assistant:

static int calc_size(adiak_datatype_t* datatype)
{
   switch (datatype->dtype) {
      case adiak_type_unset:
         return -1;
      case adiak_long:
      case adiak_ulong:
      case adiak_date:
         return sizeof(long);
      case adiak_longlong:
      case adiak_ulonglong:
         return sizeof(long long);
      case adiak_int:
      case adiak_uint:
         return sizeof(int);
      case adiak_double:
         return sizeof(double);
      case adiak_timeval:
         return sizeof(struct timeval *);
      case adiak_version:
      case adiak_string:
      case adiak_catstring:
      case adiak_path:
         return sizeof(char *);
      case adiak_range:
      case adiak_set:
      case adiak_list: {
         int num_elements = datatype->num_elements + datatype->num_ref_elements;
         return (num_elements * calc_size(datatype->subtype[0]));
      }
      case adiak_tuple: {
         int bytes = 0;
         for (int i = 0; i < datatype->num_subtypes; ++i)
            bytes += calc_size(datatype->subtype[i]);
         return bytes;
      }
   }
   return -1;
}